

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onEnterBlockStatementAstNode
          (CompilerAstWalker *this,BlockStatementAstNode *param_1)

{
  element_type *this_00;
  BlockStatementAstNode *param_1_local;
  CompilerAstWalker *this_local;
  
  this_00 = std::
            __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->ec);
  EmissionContext::PushScope(this_00);
  return;
}

Assistant:

void onEnterBlockStatementAstNode(BlockStatementAstNode*  /*node*/) noexcept override {
    this->ec->PushScope();
  }